

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

void __thiscall
olc::Renderer_OGL10::DrawLayerQuad(Renderer_OGL10 *this,vf2d *offset,vf2d *scale,Pixel tint)

{
  glBegin(7);
  glColor4ub((uint)tint.field_0 & 0xff,(uint)tint.field_0 >> 8 & 0xff,
             (uint)tint.field_0 >> 0x10 & 0xff,(uint)tint.field_0 >> 0x18);
  glTexCoord2f(scale->x * 0.0 + offset->x,scale->y + offset->y);
  glVertex3f(0xbf800000,0xbf800000,0);
  glTexCoord2f(scale->x * 0.0 + offset->x,scale->y * 0.0 + offset->y);
  glVertex3f(0xbf800000,0x3f800000,0);
  glTexCoord2f(scale->x + offset->x,scale->y * 0.0 + offset->y);
  glVertex3f(0x3f800000,0x3f800000,0);
  glTexCoord2f(scale->x + offset->x,scale->y + offset->y);
  glVertex3f(0x3f800000,0xbf800000,0);
  glEnd();
  return;
}

Assistant:

void DrawLayerQuad(const olc::vf2d& offset, const olc::vf2d& scale, const olc::Pixel tint) override
		{
			glBegin(GL_QUADS);
			glColor4ub(tint.r, tint.g, tint.b, tint.a);
			glTexCoord2f(0.0f * scale.x + offset.x, 1.0f * scale.y + offset.y);
			glVertex3f(-1.0f /*+ vSubPixelOffset.x*/, -1.0f /*+ vSubPixelOffset.y*/, 0.0f);
			glTexCoord2f(0.0f * scale.x + offset.x, 0.0f * scale.y + offset.y);
			glVertex3f(-1.0f /*+ vSubPixelOffset.x*/, 1.0f /*+ vSubPixelOffset.y*/, 0.0f);
			glTexCoord2f(1.0f * scale.x + offset.x, 0.0f * scale.y + offset.y);
			glVertex3f(1.0f /*+ vSubPixelOffset.x*/, 1.0f /*+ vSubPixelOffset.y*/, 0.0f);
			glTexCoord2f(1.0f * scale.x + offset.x, 1.0f * scale.y + offset.y);
			glVertex3f(1.0f /*+ vSubPixelOffset.x*/, -1.0f /*+ vSubPixelOffset.y*/, 0.0f);
			glEnd();
		}